

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTFlightData.cpp
# Opt level: O2

bool __thiscall LTFlightData::AircraftMaintenance(LTFlightData *this,double simTime)

{
  iterator *this_00;
  dequePositionTy *this_01;
  LTAircraft *pLVar1;
  flightPhaseE fVar2;
  bool bVar3;
  size_type sVar4;
  reference ppVar5;
  unique_lock<std::recursive_mutex> lock;
  
  lock._M_device = &this->dataAccessMutex;
  lock._M_owns = std::recursive_mutex::try_lock(lock._M_device);
  if (lock._M_owns) {
    if (dataRefs.labelCfg != this->labelCfg) {
      UpdateStaticLabel(this);
    }
    if (dataRefs.bReInitAll == false) {
      pLVar1 = this->pAc;
      if (pLVar1 == (LTAircraft *)0x0) {
        this_00 = &(this->posDeque).super__Deque_base<positionTy,_std::allocator<positionTy>_>.
                   _M_impl.super__Deque_impl_data._M_start;
        this_01 = &this->posDeque;
        while ((sVar4 = std::deque<positionTy,_std::allocator<positionTy>_>::size(this_01),
               1 < sVar4 &&
               (ppVar5 = std::_Deque_iterator<positionTy,_positionTy_&,_positionTy_*>::operator[]
                                   (this_00,1), ppVar5->_ts <= simTime && simTime != ppVar5->_ts)))
        {
          std::deque<positionTy,_std::allocator<positionTy>_>::pop_front(this_01);
        }
        sVar4 = std::deque<positionTy,_std::allocator<positionTy>_>::size(this_01);
        if (1 < sVar4) {
          bVar3 = validForAcCreate(this,simTime);
          if (bVar3) {
            CreateAircraft(this,simTime);
          }
          else if (this_00->_M_cur->_ts <= simTime) {
            TriggerCalcNewPos(this,NAN);
          }
        }
      }
      else if (((pLVar1->super_Aircraft).bValid != true) ||
              ((double)(dataRefs.fdStdDistance * 0x73c) < (pLVar1->vecView).dist)) {
        DestroyAircraft(this);
      }
      else {
        fVar2 = pLVar1->phase;
        if (fVar2 < FPH_LANDING) {
          if ((fVar2 < FPH_APPROACH) || (bVar3 = positionTy::isNormal(&this->posRwy,false), !bVar3))
          goto LAB_00160e1f;
          fVar2 = this->pAc->phase;
        }
        if (fVar2 < FPH_STOPPED_ON_RWY) goto LAB_00160e6d;
      }
LAB_00160e1f:
      if ((double)(~-(ulong)NAN(simTime) & (ulong)simTime |
                  (ulong)dataRefs.lastSimTime & -(ulong)NAN(simTime)) <=
          (double)(dataRefs.fdBufPeriod * 2) + this->youngestTS) goto LAB_00160e6d;
    }
    bVar3 = true;
    SetInvalid(this,false);
  }
  else {
LAB_00160e6d:
    bVar3 = false;
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&lock);
  return bVar3;
}

Assistant:

bool LTFlightData::AircraftMaintenance ( double simTime )
{
    try {
        // try to lock data access
        std::unique_lock<std::recursive_mutex> lock (dataAccessMutex, std::try_to_lock);
        if ( !lock )                // we didn't get the lock, just return w/o deletion
            return false;
        
        // do we need to recalc the static part of the a/c label due to config change?
        if (dataRefs.GetLabelCfg() != labelCfg)
            UpdateStaticLabel();
        
        // general re-init necessary?
        if (dataRefs.IsReInitAll()) {
            SetInvalid(false);
            return true;
        }

        // Tests on an existing aircraft object
        if (hasAc())
        {
            // if the a/c became invalid or has flown out of sight
            // then remove the aircraft object,
            // but retain the remaining flight data
            if (!pAc->IsValid() ||
                pAc->GetVecView().dist > dataRefs.GetFdStdDistance_m())
                DestroyAircraft();
            else {
                // cover the special case of finishing landing and roll-out without live positions
                // i.e. during approach and landing we don't destroy the aircraft
                //      if it is approaching some runway
                //      until it finally stopped on the runway
                if ((pAc->GetFlightPhase() >= FPH_LANDING ||
                        (pAc->GetFlightPhase() >= FPH_APPROACH && posRwy.isNormal())) &&
                    pAc->GetFlightPhase() < FPH_STOPPED_ON_RWY)
                {
                    return false;
                }
            }
        }
        // Tests when not (yet) having an aircraft object
        else {
            // Remove position from the beginning for as long as there is past data,
            // i.e.: Only the .front pos may be in the past
            while (posDeque.size() >= 2 && posDeque[1].ts() < simTime)
                posDeque.pop_front();

            // Have at least two positions?
            if (posDeque.size() >= 2 ) {
                // is already valid for a/c creation?
                if ( validForAcCreate(simTime) )
                    // then do create the aircraft
                    CreateAircraft(simTime);
                else // not yet valid
                    // but the oldest position is at or before current simTime?
                    // then chances are good that we can calculate positions
                    if ( posDeque.front().ts() <= simTime)
                        // start thread for position calculation...next time we might be valid for creation
                        TriggerCalcNewPos(NAN);
            }
        }
            
        // youngestTS longer ago than allowed? -> remove the entire FD object
        if (youngestTS + dataRefs.GetAcOutdatedIntvl() <
            (std::isnan(simTime) ? dataRefs.GetSimTime() : simTime))
        {
            SetInvalid(false);
            return true;
        }

        // don't delete me
        return false;
        
    } catch(const std::system_error& e) {
        LOG_MSG(logERR, ERR_LOCK_ERROR, key().c_str(), e.what());
    } catch(...) {
    }
    
    // in case of error return 'delete me'
    SetInvalid();
    return true;
}